

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastQueue.hpp
# Opt level: O3

void __thiscall
BCL::
FastQueue<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
::~FastQueue(FastQueue<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
             *this)

{
  size_t sVar1;
  size_t sVar2;
  GlobalPtr<int> local_18;
  
  if ((my_rank == this->my_host) && (bcl_finalized == '\0')) {
    sVar1 = (this->head).rank;
    sVar2 = (this->head).ptr;
    if (sVar1 != 0 || sVar2 != 0) {
      local_18.rank = sVar1;
      local_18.ptr = sVar2;
      local_free<int>(&local_18);
    }
    sVar1 = (this->tail).rank;
    sVar2 = (this->tail).ptr;
    if (sVar1 != 0 || sVar2 != 0) {
      local_18.rank = sVar1;
      local_18.ptr = sVar2;
      local_free<int>(&local_18);
    }
  }
  Array<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
  ::~Array(&this->data);
  return;
}

Assistant:

~FastQueue() {
    if (BCL::rank() == host() && !BCL::bcl_finalized) {
      if (head != nullptr) {
        dealloc(head);
      }
      if (tail != nullptr) {
        dealloc(tail);
      }
    }
  }